

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

void __thiscall t_dart_generator::generate_dart_library(t_dart_generator *this)

{
  ulong uVar1;
  char *pcVar2;
  ostream *poVar3;
  int __oflag;
  string *psVar4;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [32];
  undefined1 local_2c0 [8];
  ofstream_with_content_based_conditional_update f_library;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30 [8];
  string f_library_name;
  t_dart_generator *this_local;
  
  f_library_name.field_2._8_8_ = this;
  std::__cxx11::string::string(local_30);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])
              (&f_library.field_0x198);
    std::operator+(&local_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &f_library.field_0x198,"/");
    std::operator+(&local_e0,&local_100,&this->library_name_);
    std::operator+(&local_c0,&local_e0,".dart");
    std::__cxx11::string::operator=(local_30,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&f_library.field_0x198);
  }
  else {
    std::operator+(&local_90,&this->base_dir_,"/lib/");
    std::operator+(&local_70,&local_90,&this->library_name_);
    std::operator+(&local_50,&local_70,".dart");
    std::__cxx11::string::operator=(local_30,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_2c0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,pcVar2,&local_2e1);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_2c0,(char *)local_2e0,__oflag);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_308);
  poVar3 = std::operator<<((ostream *)local_2c0,local_308);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string(local_308);
  poVar3 = std::operator<<((ostream *)local_2c0,"library ");
  poVar3 = std::operator<<(poVar3,(string *)&this->library_prefix_);
  poVar3 = std::operator<<(poVar3,(string *)&this->library_name_);
  poVar3 = std::operator<<(poVar3,";");
  std::operator<<(poVar3,(string *)&endl2_abi_cxx11_);
  psVar4 = &this->library_exports_;
  std::operator<<((ostream *)local_2c0,(string *)psVar4);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_2c0,(int)psVar4);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_2c0);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void t_dart_generator::generate_dart_library() {
  string f_library_name;
  if (library_prefix_.empty()) {
    f_library_name = base_dir_ + "/lib/" + library_name_ + ".dart";
  } else {
    f_library_name = get_out_dir() + "/" + library_name_ + ".dart";
  }

  ofstream_with_content_based_conditional_update f_library;
  f_library.open(f_library_name.c_str());

  f_library << autogen_comment() << endl;
  f_library << "library " << library_prefix_ << library_name_ << ";" << endl2;
  f_library << library_exports_;

  f_library.close();
}